

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::idchar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  byte bVar1;
  undefined1 local_28 [8];
  LexCtx ctx;
  
  ctx.input._M_len = in._M_len;
  ctx.input._M_str = (char *)0x0;
  if (this == (anon_unknown_10 *)0x0) {
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._M_engaged =
         false;
  }
  else {
    local_28 = (undefined1  [8])this;
    bVar1 = LexCtx::peek((LexCtx *)local_28);
    if (((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
        ((bVar1 - 0x21 < 0x40 && ((0xe8000000fa00767dU >> ((ulong)(bVar1 - 0x21) & 0x3f) & 1) != 0))
        )) || ((bVar1 == 0x7e || (bVar1 == 0x7c)))) {
      ctx.input._M_str = ctx.input._M_str + 1;
    }
    LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> idchar(std::string_view in) {
  LexCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  uint8_t c = ctx.peek();
  if (('0' <= c && c <= '9') || ('A' <= c && c <= 'Z') ||
      ('a' <= c && c <= 'z')) {
    ctx.take(1);
  } else {
    switch (c) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
      case '-':
      case '.':
      case '/':
      case ':':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case '\\':
      case '^':
      case '_':
      case '`':
      case '|':
      case '~':
        ctx.take(1);
    }
  }
  return ctx.lexed();
}